

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

int translate_srcfiles_to_srcfiles2(char **srcfiles,Dwarf_Signed srcfiles_count,char **srcfiles2)

{
  char *__s;
  size_t inlen;
  char *out;
  size_t slen;
  char *newstr;
  char *ostr;
  Dwarf_Signed i;
  char **srcfiles2_local;
  Dwarf_Signed srcfiles_count_local;
  char **srcfiles_local;
  
  ostr = (char *)0x0;
  while( true ) {
    if (srcfiles_count <= (long)ostr) {
      return 0;
    }
    __s = srcfiles[(long)ostr];
    inlen = strlen(__s);
    out = (char *)calloc(1,inlen + 1);
    if (out == (char *)0x0) break;
    _dwarf_safe_strcpy(out,inlen + 1,__s,inlen);
    srcfiles2[(long)ostr] = out;
    ostr = ostr + 1;
  }
  return 1;
}

Assistant:

static int
translate_srcfiles_to_srcfiles2(char **srcfiles,
    Dwarf_Signed srcfiles_count,
    char **srcfiles2)
{
    Dwarf_Signed i = 0;

    for (i = 0; i < srcfiles_count; ++i) {
        char * ostr = 0;
        char * newstr = 0;
        size_t slen = 0;

        ostr = srcfiles[i];
        slen = strlen(ostr);
        newstr =  calloc(1,slen+1);
        if (!newstr) {
            return DW_DLV_ERROR;
        }
        _dwarf_safe_strcpy(newstr,slen+1,ostr,slen);
        srcfiles2[i] = newstr;
    }
    return DW_DLV_OK;
}